

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parameterset.cpp
# Opt level: O2

void __thiscall ParameterSet::addParameter(ParameterSet *this,string *_name,bool _defaultValue)

{
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>
  local_58;
  
  std::__cxx11::string::string((string *)&local_58,(string *)_name);
  local_58.second = false;
  local_58._33_3_ = 0;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,Type>,std::_Select1st<std::pair<std::__cxx11::string_const,Type>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,Type>>>
  ::_M_emplace_unique<std::pair<std::__cxx11::string,Type>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,Type>,std::_Select1st<std::pair<std::__cxx11::string_const,Type>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,Type>>>
              *)&this->type_dict,
             (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Type>
              *)&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::string((string *)&local_58,(string *)_name);
  local_58.second = _defaultValue;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,bool>,std::_Select1st<std::pair<std::__cxx11::string_const,bool>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,bool>>>
  ::_M_emplace_unique<std::pair<std::__cxx11::string,bool>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,bool>,std::_Select1st<std::pair<std::__cxx11::string_const,bool>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,bool>>>
              *)&this->bool_dict,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  return;
}

Assistant:

void ParameterSet::addParameter(const string &_name, bool _defaultValue)
{
    type_dict.insert(std::make_pair(_name, BOOL));
    bool_dict.insert(std::make_pair(_name, _defaultValue));
}